

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralCurveConnection::~IfcStructuralCurveConnection
          (IfcStructuralCurveConnection *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].super_IfcStructuralConnection.field_0x28 = 0x890968;
  *(undefined8 *)&(this->super_IfcStructuralConnection).field_0x10 = 0x8909e0;
  *(undefined8 *)&this[-1].super_IfcStructuralConnection.field_0xb0 = 0x890990;
  *(undefined8 *)&this[-1].super_IfcStructuralConnection.field_0xc0 = 0x8909b8;
  puVar1 = *(undefined1 **)&this[-1].super_IfcStructuralConnection.field_0xd0;
  if (puVar1 != &this[-1].super_IfcStructuralConnection.field_0xe0) {
    operator_delete(puVar1);
  }
  *(undefined8 *)&this[-1].super_IfcStructuralConnection.field_0x28 = 0x890a80;
  *(undefined8 *)&(this->super_IfcStructuralConnection).field_0x10 = 0x890aa8;
  puVar1 = *(undefined1 **)&this[-1].super_IfcStructuralConnection.field_0x88;
  if (puVar1 != &this[-1].super_IfcStructuralConnection.field_0x98) {
    operator_delete(puVar1);
  }
  puVar1 = *(undefined1 **)&this[-1].super_IfcStructuralConnection.field_0x60;
  if (puVar1 != &this[-1].super_IfcStructuralConnection.field_0x70) {
    operator_delete(puVar1);
  }
  puVar1 = *(undefined1 **)&this[-1].super_IfcStructuralConnection.field_0x38;
  if (puVar1 != &this[-1].super_IfcStructuralConnection.field_0x48) {
    operator_delete(puVar1);
  }
  operator_delete(&this[-1].super_IfcStructuralConnection.field_0x28);
  return;
}

Assistant:

IfcStructuralCurveConnection() : Object("IfcStructuralCurveConnection") {}